

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_var_ref(sexp ctx,sexp x,sexp_conflict *varenv)

{
  sexp ctx_00;
  undefined8 uVar1;
  undefined8 in_RDX;
  undefined4 localp;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp cell;
  sexp res;
  sexp env;
  sexp cell_00;
  sexp value;
  undefined8 in_stack_ffffffffffffffd8;
  
  localp = (undefined4)((ulong)in_RDX >> 0x20);
  uVar1 = (((sexp)in_RDI)->value).type.cpl;
  memset(&stack0xffffffffffffffc0,0,0x10);
  cell_00 = (sexp)&stack0xffffffffffffffd0;
  value = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  ctx_00 = sexp_env_cell_loc(unaff_retaddr,(sexp)in_RDI,(sexp)in_RSI,localp,(sexp_conflict *)uVar1);
  if (ctx_00 == (sexp)0x0) {
    ctx_00 = sexp_env_cell_create
                       ((sexp)uVar1,(sexp)in_stack_ffffffffffffffd8,(sexp)0x0,value,
                        (sexp_conflict *)cell_00);
  }
  if (((((ctx_00->value).string.offset & 3) == 0) && (((ctx_00->value).type.cpl)->tag == 0x15)) ||
     ((((ctx_00->value).string.offset & 3) == 0 && (((ctx_00->value).type.cpl)->tag == 0x19)))) {
    uVar1 = sexp_compile_error(ctx,(char *)x,(sexp)varenv);
  }
  else {
    uVar1 = sexp_make_ref(ctx_00,value,cell_00);
  }
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)value;
  return (sexp)uVar1;
}

Assistant:

static sexp analyze_var_ref (sexp ctx, sexp x, sexp *varenv) {
  sexp env = sexp_context_env(ctx), res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_env_cell_loc(ctx, env, x, 0, varenv);
  if (! cell) {
    cell = sexp_env_cell_create(ctx, env, x, SEXP_UNDEF, varenv);
  }
  if (sexp_macrop(sexp_cdr(cell)) || sexp_corep(sexp_cdr(cell))) {
    res = sexp_compile_error(ctx, "invalid use of syntax as value", x);
  } else {
    res = sexp_make_ref(ctx, sexp_car(cell), cell);
  }
  sexp_gc_release1(ctx);
  return res;
}